

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateExport.cpp
# Opt level: O1

HelicsCore helicsFederateGetCore(HelicsFederate fed,HelicsError *err)

{
  Federate *pFVar1;
  _Head_base<0UL,_helics::CoreObject_*,_false> _Var2;
  __single_object core;
  _Head_base<0UL,_helics::CoreObject_*,_false> local_28;
  __uniq_ptr_impl<helics::CoreObject,_std::default_delete<helics::CoreObject>_> local_20;
  MasterObjectHolder *local_18;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_10;
  
  pFVar1 = getFed(fed,err);
  if (pFVar1 == (Federate *)0x0) {
    _Var2._M_head_impl = (CoreObject *)0x0;
  }
  else {
    local_28._M_head_impl = (CoreObject *)operator_new(0x48);
    ((local_28._M_head_impl)->coreptr).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    ((local_28._M_head_impl)->coreptr).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    ((local_28._M_head_impl)->filters).
    super__Vector_base<std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>,_std::allocator<std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    ((local_28._M_head_impl)->filters).
    super__Vector_base<std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>,_std::allocator<std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    ((local_28._M_head_impl)->filters).
    super__Vector_base<std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>,_std::allocator<std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ((local_28._M_head_impl)->translators).
    super__Vector_base<std::unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>,_std::allocator<std::unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    ((local_28._M_head_impl)->translators).
    super__Vector_base<std::unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>,_std::allocator<std::unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    ((local_28._M_head_impl)->translators).
    super__Vector_base<std::unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>,_std::allocator<std::unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (local_28._M_head_impl)->index = 0;
    (local_28._M_head_impl)->valid = 0;
    (local_28._M_head_impl)->valid = -2;
    (local_28._M_head_impl)->valid = 0x378424ec;
    ((local_28._M_head_impl)->coreptr).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (pFVar1->coreObject).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&((local_28._M_head_impl)->coreptr).
                super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               &(pFVar1->coreObject).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    _Var2._M_head_impl = local_28._M_head_impl;
    getMasterHolder();
    local_20._M_t.
    super__Tuple_impl<0UL,_helics::CoreObject_*,_std::default_delete<helics::CoreObject>_>.
    super__Head_base<0UL,_helics::CoreObject_*,_false>._M_head_impl =
         (tuple<helics::CoreObject_*,_std::default_delete<helics::CoreObject>_>)
         (tuple<helics::CoreObject_*,_std::default_delete<helics::CoreObject>_>)
         local_28._M_head_impl;
    local_28._M_head_impl = (CoreObject *)0x0;
    MasterObjectHolder::addCore
              (local_18,(unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_> *)
                        &local_20);
    std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>::~unique_ptr
              ((unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_> *)&local_20
              );
    if (local_10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_10);
    }
    std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>::~unique_ptr
              ((unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_> *)&local_28
              );
  }
  return _Var2._M_head_impl;
}

Assistant:

HelicsCore helicsFederateGetCore(HelicsFederate fed, HelicsError* err)
{
    auto* fedObj = getFed(fed, err);
    if (fedObj == nullptr) {
        return nullptr;
    }
    auto core = std::make_unique<helics::CoreObject>();
    core->valid = gCoreValidationIdentifier;
    core->coreptr = fedObj->getCorePointer();
    auto* retcore = reinterpret_cast<HelicsCore>(core.get());
    getMasterHolder()->addCore(std::move(core));
    return retcore;
}